

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O0

bool __thiscall CDBIterator::GetValue<Coin>(CDBIterator *this,Coin *value)

{
  long lVar1;
  Span<const_std::byte> sp;
  DataStream *this_00;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar2;
  exception *anon_var_0;
  DataStream ssValue;
  CDBWrapper *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  CDBIterator *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar2 = GetValueImpl(in_stack_ffffffffffffff78);
  sp.m_size = in_stack_ffffffffffffff98;
  sp.m_data = SVar2.m_data;
  DataStream::DataStream(in_RDI,sp);
  this_00 = (DataStream *)dbwrapper_private::GetObfuscateKey(in_stack_ffffffffffffff68);
  DataStream::Xor((DataStream *)SVar2.m_size,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  DataStream::operator>>
            (this_00,(Coin *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool GetValue(V& value) {
        try {
            DataStream ssValue{GetValueImpl()};
            ssValue.Xor(dbwrapper_private::GetObfuscateKey(parent));
            ssValue >> value;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }